

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_transaction.cpp
# Opt level: O0

GetIndexDataStruct *
cfd::js::api::TransactionStructApi::GetTxInIndex
          (GetIndexDataStruct *__return_storage_ptr__,GetTxInIndexRequestStruct *request)

{
  GetTxInIndexRequestStruct *this;
  string *in_R8;
  allocator local_129;
  function<cfd::js::api::GetIndexDataStruct_(const_cfd::js::api::GetTxInIndexRequestStruct_&)>
  local_128;
  undefined1 local_108 [238];
  undefined1 local_1a;
  anon_class_1_0_00000001 local_19;
  GetTxInIndexRequestStruct *pGStack_18;
  anon_class_1_0_00000001 call_func;
  GetTxInIndexRequestStruct *request_local;
  GetIndexDataStruct *result;
  
  local_1a = 0;
  pGStack_18 = request;
  GetIndexDataStruct::GetIndexDataStruct(__return_storage_ptr__);
  this = pGStack_18;
  std::function<cfd::js::api::GetIndexDataStruct(cfd::js::api::GetTxInIndexRequestStruct_const&)>::
  function<cfd::js::api::TransactionStructApi::GetTxInIndex(cfd::js::api::GetTxInIndexRequestStruct_const&)::__0&,void>
            ((function<cfd::js::api::GetIndexDataStruct(cfd::js::api::GetTxInIndexRequestStruct_const&)>
              *)local_108,&local_19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_128,"GetTxInIndex",&local_129);
  ExecuteStructApi<cfd::js::api::GetTxInIndexRequestStruct,cfd::js::api::GetIndexDataStruct>
            ((GetIndexDataStruct *)(local_108 + 0x20),(api *)this,
             (GetTxInIndexRequestStruct *)local_108,&local_128,in_R8);
  GetIndexDataStruct::operator=(__return_storage_ptr__,(GetIndexDataStruct *)(local_108 + 0x20));
  GetIndexDataStruct::~GetIndexDataStruct((GetIndexDataStruct *)(local_108 + 0x20));
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::function<cfd::js::api::GetIndexDataStruct_(const_cfd::js::api::GetTxInIndexRequestStruct_&)>
  ::~function((function<cfd::js::api::GetIndexDataStruct_(const_cfd::js::api::GetTxInIndexRequestStruct_&)>
               *)local_108);
  return __return_storage_ptr__;
}

Assistant:

GetIndexDataStruct TransactionStructApi::GetTxInIndex(
    const GetTxInIndexRequestStruct& request) {
  auto call_func = [](const GetTxInIndexRequestStruct& request)
      -> GetIndexDataStruct {  // NOLINT
    GetIndexDataStruct response;
    TransactionContext ctx(request.tx);
    response.index = ctx.GetTxInIndex(Txid(request.txid), request.vout);
    response.ignore_items.insert("indexes");
    return response;
  };

  GetIndexDataStruct result;
  result = ExecuteStructApi<GetTxInIndexRequestStruct, GetIndexDataStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}